

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::acceptDestProcessReturn
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid)

{
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  mapped_type *pmVar1;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar2;
  BaseType fid_index;
  ActionMessage unblock;
  BaseType local_ec;
  ActionMessage local_e8;
  
  local_ec = fid.gid;
  this_00 = &std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingDestFilterProcesses,&local_ec)->_M_t;
  local_e8.messageAction = pid;
  pVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range(this_00,&local_e8.messageAction);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (this_00,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  pmVar1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->ongoingDestFilterProcesses,&local_ec);
  if ((pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ActionMessage::ActionMessage(&local_e8,cmd_time_unblock);
    local_e8.source_id.gid = (this->mFedID).gid;
    local_e8.dest_id.gid = fid.gid;
    local_e8.sequenceID = pid;
    if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  clearTimeReturn(this,pid);
  return;
}

Assistant:

void FilterFederate::acceptDestProcessReturn(GlobalFederateId fid, uint32_t pid)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    ongoingDestFilterProcesses[fid_index].erase(pid);
    if (ongoingDestFilterProcesses[fid_index].empty()) {
        ActionMessage unblock(CMD_TIME_UNBLOCK);
        unblock.dest_id = fid;
        unblock.source_id = mFedID;
        unblock.sequenceID = pid;
        mSendMessage(unblock);
    }
    clearTimeReturn(pid);
}